

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_String.cc
# Opt level: O3

void __thiscall Pl_String::~Pl_String(Pl_String *this)

{
  Members *pMVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_String_002ea838;
  pMVar1 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_String::Members,_std::default_delete<Pl_String::Members>_>._M_t.
           super__Tuple_impl<0UL,_Pl_String::Members_*,_std::default_delete<Pl_String::Members>_>.
           super__Head_base<0UL,_Pl_String::Members_*,_false>._M_head_impl;
  if (pMVar1 != (Members *)0x0) {
    operator_delete(pMVar1,8);
  }
  (this->m)._M_t.super___uniq_ptr_impl<Pl_String::Members,_std::default_delete<Pl_String::Members>_>
  ._M_t.super__Tuple_impl<0UL,_Pl_String::Members_*,_std::default_delete<Pl_String::Members>_>.
  super__Head_base<0UL,_Pl_String::Members_*,_false>._M_head_impl = (Members *)0x0;
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002ea020;
  pcVar2 = (this->super_Pipeline).identifier._M_dataplus._M_p;
  paVar3 = &(this->super_Pipeline).identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Pl_String::~Pl_String() = default;